

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7a016f::HandleAsciiCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  cmExecutionStatus *this;
  size_type sVar1;
  char *__nptr;
  const_reference str;
  cmMakefile *this_00;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string error;
  string local_88 [4];
  int ch;
  string output;
  string *outvar;
  size_type cc;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No output variable specified",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    output.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)status_local);
    std::__cxx11::string::string(local_88);
    outvar = (string *)0x1;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      if ((string *)(sVar1 - 1) <= outvar) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(size_type)outvar);
      __nptr = (char *)std::__cxx11::string::c_str();
      error.field_2._12_4_ = atoi(__nptr);
      if (((int)error.field_2._12_4_ < 1) || (0xff < (int)error.field_2._12_4_)) {
        cmAlphaNum::cmAlphaNum(&local_e0,"Character with code ");
        str = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,(size_type)outvar);
        cmAlphaNum::cmAlphaNum(&local_110,str);
        cmStrCat<char[17]>((string *)local_b0,&local_e0,&local_110,(char (*) [17])0xdd3085);
        cmExecutionStatus::SetError(local_20,(string *)local_b0);
        args_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_b0);
        goto LAB_004807ab;
      }
      std::__cxx11::string::operator+=(local_88,error.field_2._M_local_buf[0xc]);
      outvar = (string *)&outvar->field_0x1;
    }
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    name = output.field_2._8_8_;
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_88);
    cmMakefile::AddDefinition(this_00,(string *)name,value);
    args_local._7_1_ = 1;
LAB_004807ab:
    std::__cxx11::string::~string(local_88);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleAsciiCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("No output variable specified");
    return false;
  }
  std::string::size_type cc;
  std::string const& outvar = args.back();
  std::string output;
  for (cc = 1; cc < args.size() - 1; cc++) {
    int ch = atoi(args[cc].c_str());
    if (ch > 0 && ch < 256) {
      output += static_cast<char>(ch);
    } else {
      std::string error =
        cmStrCat("Character with code ", args[cc], " does not exist.");
      status.SetError(error);
      return false;
    }
  }
  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}